

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_d00580::ExternalFrameBufferTest_EightJitterBuffers_Test::
~ExternalFrameBufferTest_EightJitterBuffers_Test
          (ExternalFrameBufferTest_EightJitterBuffers_Test *this)

{
  ExternalFrameBufferTest::~ExternalFrameBufferTest(&this->super_ExternalFrameBufferTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ExternalFrameBufferTest, EightJitterBuffers) {
  // Number of buffers equals #AOM_MAXIMUM_REF_BUFFERS +
  // #AOM_MAXIMUM_WORK_BUFFERS + eight jitter buffers.
  const int jitter_buffers = 8;
  const int num_buffers =
      AOM_MAXIMUM_REF_BUFFERS + AOM_MAXIMUM_WORK_BUFFERS + jitter_buffers;
  ASSERT_EQ(AOM_CODEC_OK,
            SetFrameBufferFunctions(num_buffers, get_aom_frame_buffer,
                                    release_aom_frame_buffer));
  ASSERT_EQ(AOM_CODEC_OK, DecodeRemainingFrames());
}